

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBTree.h
# Opt level: O3

RBTree<int> * __thiscall
BinTrees::RBTree<int>::gen(RBTree<int> *this,initializer_list<int> l,int *sum)

{
  int iVar1;
  int iVar2;
  RBTree<int> *this_00;
  BinSTree<int> *this_01;
  int *piVar3;
  int iVar4;
  int *v;
  
  piVar3 = (int *)l._M_len;
  *piVar3 = 0;
  this_00 = (RBTree<int> *)operator_new(0x28);
  iVar4 = (this->super_BinSTree<int>).super_BinTree<int>.v;
  (this_00->super_BinSTree<int>).super_BinTree<int>.v = iVar4;
  *(undefined8 *)((long)&(this_00->super_BinSTree<int>).super_BinTree<int>.r + 1) = 0;
  *(undefined8 *)((long)&(this_00->super_BinSTree<int>).super_BinTree<int>.p + 1) = 0;
  (this_00->super_BinSTree<int>).super_BinTree<int>.l = (BinTree<int> *)0x0;
  (this_00->super_BinSTree<int>).super_BinTree<int>.r = (BinTree<int> *)0x0;
  *piVar3 = iVar4;
  if (1 < (long)l._M_array) {
    v = (int *)&(this->super_BinSTree<int>).super_BinTree<int>.field_0x4;
    do {
      this_00 = i<int_const&>(this_00,v);
      this_01 = BinSTree<int>::search(&this_00->super_BinSTree<int>,v);
      iVar1 = BinSTree<int>::suc(this_01);
      iVar4 = (this_01->super_BinTree<int>).v;
      iVar1 = iVar1 - iVar4;
      iVar2 = BinSTree<int>::pre(this_01);
      iVar4 = iVar4 - iVar2;
      if (iVar1 <= iVar4) {
        iVar4 = iVar1;
      }
      *piVar3 = *piVar3 + iVar4;
      v = v + 1;
    } while (v < &(this->super_BinSTree<int>).super_BinTree<int>.v + (long)l._M_array);
  }
  return this_00;
}

Assistant:

RBTree<T> *RBTree<T>::gen(std::initializer_list<T> l, T &sum) {
        sum = 0;
        auto t = new RBTree<T>(*(l.begin()));
        const BinTrees::BinSTree<int> *p = t;
        sum += *(l.begin());
        auto i = l.begin() + 1;
        for (i; i < l.end(); i++) {
            t = t->i(*i);
            p = &(t->search(*i));
            sum += std::min(p->suc() - p->V(), p->V() - p->pre());
        }
        return t;
    }